

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O3

RK_S32 mpp_hevc_output_frame(void *ctx,int flush)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int in_EDX;
  HEVCContext *s;
  undefined4 in_register_00000034;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  if (*(int *)(CONCAT44(in_register_00000034,flush) + 0x1c) == 0) {
    lVar4 = (long)ctx + 0xcd0;
    iVar9 = 0x7fffffff;
    uVar8 = 0;
    uVar6 = 0;
    iVar7 = 0;
    while( true ) {
      do {
        if (((*(byte *)((long)ctx + uVar8 * 0x40 + 0xd02) & 1) != 0) &&
           (lVar10 = uVar8 * 0x40 + lVar4,
           *(short *)(lVar10 + 0x30) == *(short *)((long)ctx + 0x1136))) {
          iVar7 = iVar7 + 1;
          iVar3 = *(int *)(lVar10 + 0x14);
          if (iVar3 < iVar9) {
            uVar6 = uVar8 & 0xffffffff;
            iVar9 = iVar3;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x11);
      if ((((in_EDX == 0) && (*(short *)((long)ctx + 0x1136) == *(short *)((long)ctx + 0x1134))) &&
          (lVar10 = *(long *)((long)ctx + 0x20), lVar10 != 0)) &&
         (iVar7 <= *(int *)(lVar10 + 0x4c + (long)*(int *)(lVar10 + 0x50) * 0xc))) {
        if (*(int *)(CONCAT44(in_register_00000034,flush) + 0x38) == 0) {
          return 0;
        }
        if (*(int *)((long)ctx + 0xcc0) - 0x10U < 3) {
          if (*(int *)((long)ctx + 0x25760) != 0) {
            return 0;
          }
        }
        else if (1 < *(int *)((long)ctx + 0xcc0) - 0x13U) {
          return 0;
        }
        *(undefined4 *)((long)ctx + 0x25760) = 1;
      }
      if (iVar7 != 0) {
        lVar11 = (long)(int)uVar6 * 0x40;
        pbVar1 = (byte *)((long)ctx + lVar11 + 0xd02);
        *pbVar1 = *pbVar1 & 0xfe;
        lVar10 = lVar4 + lVar11;
        *(char *)((long)ctx + 0x256d8) = (char)uVar6;
        mpp_buf_slot_set_flag
                  (*(MppBufSlots *)((long)ctx + 0x25710),*(RK_S32 *)((long)ctx + lVar11 + 0xd04),
                   SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue
                  (*(MppBufSlots *)((long)ctx + 0x25710),*(RK_S32 *)((long)ctx + lVar11 + 0xd04),
                   QUEUE_DISPLAY);
        if (((byte)h265d_debug & 0x80) != 0) {
          _mpp_log_l(4,"H265D_PARSER","Output frame with POC %d frame->slot_index = %d\n",
                     (char *)0x0,(ulong)*(uint *)(lVar10 + 0x14),(ulong)*(uint *)(lVar10 + 0x34));
        }
        goto LAB_0019d348;
      }
      if (*(short *)((long)ctx + 0x1136) == *(short *)((long)ctx + 0x1134)) break;
      *(ushort *)((long)ctx + 0x1136) = *(short *)((long)ctx + 0x1136) + 1U & 0xff;
      uVar8 = 0;
      uVar6 = 0;
      iVar9 = 0x7fffffff;
      iVar7 = 0;
    }
  }
  else {
    lVar4 = *(long *)((long)ctx + 0xcc8);
    if ((lVar4 != 0) && ((*(byte *)(lVar4 + 0x32) & 1) != 0)) {
      *(byte *)(lVar4 + 0x32) = *(byte *)(lVar4 + 0x32) & 0xfe;
      mpp_buf_slot_set_flag
                (*(MppBufSlots *)((long)ctx + 0x25710),*(RK_S32 *)(lVar4 + 0x34),SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue
                (*(MppBufSlots *)((long)ctx + 0x25710),
                 *(RK_S32 *)(*(long *)((long)ctx + 0xcc8) + 0x34),QUEUE_DISPLAY);
    }
  }
  return 0;
LAB_0019d348:
  lVar11 = lVar4;
  uVar5 = 0;
LAB_0019d34d:
  bVar2 = *(byte *)(lVar11 + 0x32);
  if ((((bVar2 & 1) == 0) || (*(short *)(lVar11 + 0x30) != *(short *)((long)ctx + 0x1136))) ||
     (*(int *)(lVar11 + 0x14) != *(int *)(lVar10 + 0x14) + 1)) goto LAB_0019d372;
  *(char *)((long)ctx + 0x256d8) = (char)uVar5;
  *(byte *)(lVar11 + 0x32) = bVar2 & 0xfe;
  mpp_buf_slot_set_flag
            (*(MppBufSlots *)((long)ctx + 0x25710),*(RK_S32 *)(lVar11 + 0x34),SLOT_QUEUE_USE);
  mpp_buf_slot_enqueue
            (*(MppBufSlots *)((long)ctx + 0x25710),*(RK_S32 *)(lVar11 + 0x34),QUEUE_DISPLAY);
  if (((byte)h265d_debug & 0x80) != 0) {
    _mpp_log_l(4,"H265D_PARSER","Output frame with POC %d frm_next_ready->slot_index = %d\n",
               (char *)0x0,(ulong)*(uint *)(lVar11 + 0x14),(ulong)*(uint *)(lVar11 + 0x34));
  }
  lVar10 = 0xcd0;
  do {
    bVar12 = false;
    mpp_hevc_unref_frame((HEVCContext *)ctx,(HEVCFrame *)((long)ctx + lVar10),0);
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0x1110);
  goto LAB_0019d415;
LAB_0019d372:
  lVar11 = lVar11 + 0x40;
  bVar12 = 0xf < uVar5;
  uVar5 = uVar5 + 1;
  if (bVar12) goto code_r0x0019d380;
  goto LAB_0019d34d;
code_r0x0019d380:
  bVar12 = true;
  lVar11 = lVar10;
LAB_0019d415:
  lVar10 = lVar11;
  if (bVar12) {
    return 1;
  }
  goto LAB_0019d348;
}

Assistant:

static RK_S32 mpp_hevc_output_frame(void *ctx, int flush)
{

    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = (HEVCContext *)h265dctx->priv_data;
    MppDecCfgSet *cfg = h265dctx->cfg;
    RK_U32 find_next_ready = 0;

    if (cfg->base.fast_out)
        return mpp_hevc_out_dec_order(ctx);

    do {
        RK_S32 nb_output = 0;
        RK_S32 min_poc   = INT_MAX;
        RK_S32 min_idx = 0;
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *frame = &s->DPB[i];
            if ((frame->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                frame->sequence == s->seq_output) {
                nb_output++;
                if (frame->poc < min_poc) {
                    min_poc = frame->poc;
                    min_idx = i;
                }
            }
        }

        /* wait for more frames before output */
        if (!flush && s->seq_output == s->seq_decode && s->sps &&
            nb_output <= s->sps->temporal_layer[s->sps->max_sub_layers - 1].num_reorder_pics) {
            if (cfg->base.enable_fast_play && (IS_IDR(s) ||
                                               (IS_BLA(s) && !s->first_i_fast_play))) {
                s->first_i_fast_play = 1;
            } else {
                return 0;
            }
        }

        if (nb_output) {
            HEVCFrame *frame = &s->DPB[min_idx];

            frame->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
            s->output_frame_idx = min_idx;

            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);

            h265d_dbg(H265D_DBG_REF,
                      "Output frame with POC %d frame->slot_index = %d\n", frame->poc, frame->slot_index);

            do {
                find_next_ready = 0;
                for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                    HEVCFrame *frame_next_ready = &s->DPB[i];
                    if ((frame_next_ready->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                        frame_next_ready->sequence == s->seq_output) {
                        if (frame_next_ready->poc == frame->poc + 1) {
                            find_next_ready = 1;
                            s->output_frame_idx = i;
                            frame_next_ready->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
                            frame = frame_next_ready;
                            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
                            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);
                            h265d_dbg(H265D_DBG_REF,
                                      "Output frame with POC %d frm_next_ready->slot_index = %d\n",
                                      frame_next_ready->poc, frame_next_ready->slot_index);
                            /* release any frames that are now unused */
                            for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                                mpp_hevc_unref_frame(s, &s->DPB[i], 0);
                            }
                        }
                    }
                }
            } while (find_next_ready);

            return 1;
        }

        if (s->seq_output != s->seq_decode)
            s->seq_output = (s->seq_output + 1) & 0xff;
        else
            break;
    } while (1);

    return 0;
}